

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::
WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,true>>
          (Serializer *this,field_id_t field_id,char *tag,
          vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_true>
          *value)

{
  byte bVar1;
  
  if (((this->options).serialize_default_values == false) &&
     ((value->
      super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (value->
      super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar1 = 0;
    (*this->_vptr_Serializer[4])(this,field_id,tag,0);
  }
  else {
    (*this->_vptr_Serializer[4])(this,field_id,tag,1);
    WriteValue<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
              (this,value);
    bVar1 = 1;
  }
  (*this->_vptr_Serializer[5])(this,(ulong)bVar1);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && SerializationDefaultValue::IsDefault<T>(value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}